

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::LoopHeader::Init(LoopHeader *this,FunctionBody *functionBody)

{
  Type pSVar1;
  Recycler *this_00;
  ThreadContext *pTVar2;
  Recycler *alloc;
  SynchronizableList<Js::LoopEntryPointInfo_*,_JsUtil::List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *pSVar3;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  Memory::Recycler::WBSetBit((char *)&this->functionBody);
  (this->functionBody).ptr = functionBody;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->functionBody);
  pSVar1 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext;
  this_00 = pSVar1->recycler;
  pTVar2 = pSVar1->threadContext;
  local_58 = (undefined1  [8])
             &SynchronizableList<Js::LoopEntryPointInfo*,JsUtil::List<Js::LoopEntryPointInfo*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>,Js::DefaultContainerLockPolicy,CriticalSection>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2ab02c8;
  data.filename._0_4_ = 0x2529;
  alloc = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_58);
  pSVar3 = (SynchronizableList<Js::LoopEntryPointInfo_*,_JsUtil::List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
            *)new<Memory::Recycler>(0x38,alloc,0x387914);
  (pSVar3->
  super_List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ).super_ReadOnlyList<Js::LoopEntryPointInfo_*,_Memory::Recycler,_DefaultComparer>.alloc = this_00;
  (pSVar3->
  super_List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ).super_ReadOnlyList<Js::LoopEntryPointInfo_*,_Memory::Recycler,_DefaultComparer>.buffer.ptr =
       (WriteBarrierPtr<Js::LoopEntryPointInfo> *)0x0;
  (pSVar3->
  super_List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ).super_ReadOnlyList<Js::LoopEntryPointInfo_*,_Memory::Recycler,_DefaultComparer>.count = 0;
  (pSVar3->
  super_List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ).length = 0;
  (pSVar3->
  super_List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ).increment = 4;
  (pSVar3->
  super_List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ).super_ReadOnlyList<Js::LoopEntryPointInfo_*,_Memory::Recycler,_DefaultComparer>.
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014db270;
  pSVar3->syncObj = &pTVar2->csFunctionBody;
  Memory::Recycler::WBSetBit((char *)this);
  (this->entryPoints).ptr = pSVar3;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
  CreateEntryPoint(this);
  return;
}

Assistant:

void LoopHeader::Init( FunctionBody * functionBody )
    {
        // DisableJIT-TODO: Should this entire class be ifdefed out?
#if ENABLE_NATIVE_CODEGEN
        this->functionBody = functionBody;
        Recycler* recycler = functionBody->GetScriptContext()->GetRecycler();

        // Sync entryPoints changes to etw rundown lock
        auto syncObj = functionBody->GetScriptContext()->GetThreadContext()->GetFunctionBodyLock();
        this->entryPoints = RecyclerNew(recycler, LoopEntryPointList, recycler, syncObj);

        this->CreateEntryPoint();
#endif
    }